

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O2

void * sapp_d3d11_get_device(void)

{
  if (_sapp.valid) {
    return (void *)0x0;
  }
  __assert_fail("_sapp.valid",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_app.h"
                ,0x2b08,"const void *sapp_d3d11_get_device(void)");
}

Assistant:

SOKOL_API_IMPL const void* sapp_d3d11_get_device(void) {
    SOKOL_ASSERT(_sapp.valid);
    #if defined(SOKOL_D3D11)
        return _sapp.d3d11.device;
    #else
        return 0;
    #endif
}